

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O3

bool Jinx::Impl::GetDelimiterAndFormat(String *value,char *delimiter,NumericFormat *format)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  size_type sVar6;
  
  if (value->_M_string_length == 0) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    sVar6 = 0;
    uVar4 = 0;
    uVar3 = 0;
    uVar2 = 0;
    do {
      cVar5 = (value->_M_dataplus)._M_p[sVar6];
      if (cVar5 == ';') {
        uVar4 = uVar4 + 1;
      }
      else if (cVar5 == ',') {
        uVar3 = uVar3 + 1;
      }
      else if (cVar5 == '\t') {
        uVar2 = uVar2 + 1;
      }
      else if (sVar6 != 0 && cVar5 == '\n') break;
      sVar6 = sVar6 + 1;
    } while (value->_M_string_length != sVar6);
  }
  if ((uVar2 != 0 || uVar3 != 0) || uVar4 != 0) {
    cVar5 = ';';
    if (uVar4 < uVar3) {
      cVar5 = ',';
    }
    cVar1 = '\t';
    if (uVar2 <= uVar3) {
      cVar1 = cVar5;
    }
    *delimiter = cVar1;
    *format = (uint)(cVar1 == ';');
  }
  return (uVar2 != 0 || uVar3 != 0) || uVar4 != 0;
}

Assistant:

inline_t bool GetDelimiterAndFormat(const String & value, char & delimiter, NumericFormat & format)
	{
		size_t tabCount = 0;
		size_t commaCount = 0;
		size_t semicolonCount = 0;
		for (size_t i = 0; i < value.size(); ++i)
		{
			char c = value[i];
			if (c == '\t')
				++tabCount;
			else if (c == ',')
				++commaCount;
			else if (c == ';')
				++semicolonCount;
			else if (c == '\n' && i != 0)
				break;
		}
		if (tabCount == 0 && commaCount == 0 && semicolonCount == 0)
			return false;
		delimiter = (commaCount >= tabCount) ? ((commaCount > semicolonCount) ? ',' : ';') : '\t';
		format = delimiter == ';' ? NumericFormat::Continental : NumericFormat::International;
		return true;
	}